

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm_debug.cpp
# Opt level: O1

void lvm_debug(int ins_len)

{
  bool bVar1;
  vm_register *pvVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  undefined8 uVar7;
  char cVar8;
  char *pcVar9;
  _Alloc_hider _Var10;
  char *__end;
  uint break_num;
  string str;
  string break_adr;
  stringstream ss;
  long *local_270;
  long local_268;
  long local_260 [2];
  size_t local_250;
  int local_244;
  long *local_240;
  long local_238;
  long local_230 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  long local_218;
  size_type local_210 [2];
  string local_200;
  string local_1e0;
  char *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8;
  string local_1a0 [16];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_244 = ins_len;
  if (!debug_flag) {
    puts(&DAT_00107704);
  }
  debug_flag = true;
  printf("IP--------->%08X\n",(ulong)registe_ptr->IP);
  do {
    local_240 = local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"","");
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">>>>",4);
    do {
      cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x10);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&local_240,cVar3);
    } while (local_238 == 0);
    iVar4 = std::__cxx11::string::compare((char *)&local_240);
    pvVar2 = registe_ptr;
    if (iVar4 == 0) {
      registe_ptr->R6 = registe_ptr->IP + local_244;
      pvVar2->flag[0xf] = '\x01';
LAB_00106a6a:
      bVar1 = true;
      do_ins();
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_240);
      pvVar2 = registe_ptr;
      if (iVar4 == 0) {
        debug_flag = false;
        pvVar2->R6 = 0xffffffff;
        pvVar2->R7 = 0xffffffff;
        pvVar2->flag[0xf] = '\0';
        goto LAB_00106a6a;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_240);
      pvVar2 = registe_ptr;
      if (iVar4 == 0) {
        registe_ptr->flag[0xf] = '\0';
        pvVar2->R6 = 0xffffffff;
        goto LAB_00106a6a;
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_240);
      if (iVar4 == 0) {
        lvm_debug_u();
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_240);
        if (iVar4 == 0) {
          lvm_debug_p();
        }
        else {
          cVar3 = (char)*local_240;
          cVar8 = (char)(string *)&local_240;
          if (cVar3 == 's') {
            if (*(char *)((long)local_240 + 1) != 'b') goto LAB_00106bbb;
            sVar6 = std::__cxx11::string::find(cVar8,0x20);
            pcVar9 = stack_ptr;
            if (sVar6 == 0xffffffffffffffff) goto LAB_00106bc4;
            local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
            local_250 = sVar6;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_200,local_240,(char *)((long)local_240 + local_238));
            lvm_debug_d_s(pcVar9,&local_200,local_250);
            uVar7 = local_200.field_2._M_allocated_capacity;
            _Var10._M_p = local_200._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_200._M_dataplus._M_p != &local_200.field_2) goto LAB_00106ca7;
          }
          else {
            if (cVar3 == 'd') {
              if (*(char *)((long)local_240 + 1) == 'b') {
                sVar6 = std::__cxx11::string::find(cVar8,0x20);
                if (sVar6 == 0xffffffffffffffff) goto LAB_00106bc4;
                local_1c0 = data_ptr;
                local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                local_250 = sVar6;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_1e0,local_240,(char *)((long)local_240 + local_238));
                lvm_debug_d_s(local_1c0,&local_1e0,local_250);
                uVar7 = local_1e0.field_2._M_allocated_capacity;
                _Var10._M_p = local_1e0._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) goto LAB_00106ca7;
                goto LAB_00106caf;
              }
LAB_00106bbb:
              pcVar9 = &DAT_00107741;
            }
            else {
              if (cVar3 != 'b') goto LAB_00106bbb;
              lVar5 = std::__cxx11::string::find(cVar8,0x20);
              if (lVar5 != -1) {
                std::__cxx11::string::substr((ulong)&local_220,(ulong)&local_240);
                std::__cxx11::stringstream::stringstream(local_1b8);
                local_270 = local_260;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"","");
                std::__cxx11::stringbuf::str(local_1a0);
                if (local_270 != local_260) {
                  operator_delete(local_270,local_260[0] + 1);
                }
                std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_220);
                iVar4 = std::__cxx11::string::compare((char *)&local_270);
                if (local_270 != local_260) {
                  operator_delete(local_270,local_260[0] + 1);
                }
                if (iVar4 == 0) {
                  *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) =
                       *(uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18)) & 0xffffffb5 | 8;
                  std::__cxx11::string::substr((ulong)&local_270,(ulong)&local_220);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,(char *)local_270,local_268);
                  if (local_270 != local_260) {
                    operator_delete(local_270,local_260[0] + 1);
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_1a8,local_220->_M_local_buf,local_218);
                }
                std::istream::_M_extract<unsigned_int>((uint *)local_1b8);
                registe_ptr->R7 = 0;
                printf("R7--------->%08X\n");
                std::__cxx11::stringstream::~stringstream(local_1b8);
                std::ios_base::~ios_base(local_138);
                uVar7 = local_210[0];
                _Var10._M_p = (pointer)local_220;
                if (local_220 !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210) {
LAB_00106ca7:
                  operator_delete(_Var10._M_p,uVar7 + 1);
                }
                goto LAB_00106caf;
              }
LAB_00106bc4:
              pcVar9 = &DAT_0010775a;
            }
            puts(pcVar9);
          }
        }
      }
LAB_00106caf:
      bVar1 = false;
    }
    if (local_240 != local_230) {
      operator_delete(local_240,local_230[0] + 1);
    }
    if (bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void lvm_debug(int ins_len) {

	if (debug_flag != true) {
		printf("------------------------调试模式------------------------\n");
	}
	debug_flag = true;
	printf("IP--------->%08X\n", registe_ptr->IP);
FI:
	std::string str{ "" };
	std::cout << ">>>>";
YC:
	std::getline(std::cin, str);
	if (str.empty()) goto YC;
	if (str == "n")//单步
	{
		lvm_debug_n(ins_len);
		return;
	}
	else if (str == "e") {//退出调试
		lvm_debug_e();
		return;
	}
	else if (str == "c") {//运行程序
		lvm_debug_c();
		return;
	}
	else if (str == "u") {
		lvm_debug_u();
		goto FI;

	}
	else if (str == "p")//打印调试信息
	{
		lvm_debug_p();
		goto FI;//返回顶端
	}
	else if (*str.begin() == 'b') {
		auto temp = str.find(' ', 1);
		if (temp != std::string::npos) {
			std::string break_adr = str.substr(temp + 1);
			std::stringstream ss;
			ss.str("");
			unsigned break_num{ 0 };
			if (break_adr.substr(0, 2) == "0x")//16进制字符串
			{
				ss << std::hex << break_adr.substr(2);
				ss >> break_num;
			}
			else
			{
				ss << break_adr;
				ss >> break_num;
			}
			registe_ptr->R7 = break_num;
			printf("R7--------->%08X\n", registe_ptr->R7);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}
	else if (str[0] == 'd' && str[1] == 'b')
	{
		auto temp = str.find(' ', 2);
		if (temp != std::string::npos) {
			lvm_debug_d_s(data_ptr, str, temp);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}else if(str[0] == 's' && str[1] == 'b')
	{
		auto temp = str.find(' ', 2);
		if (temp != std::string::npos) {
			lvm_debug_d_s(stack_ptr,str,temp);
			goto FI;
		}
		else
		{
			printf("请输入正确的格式\n");
			goto FI;
		}
	}
	else {
		printf("请输入正确的指令\n");
		goto FI;
	}

}